

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPInternalSourceData::ProcessBYEPacket
          (RTPInternalSourceData *this,uint8_t *reason,size_t reasonlen,RTPTime *receivetime)

{
  RTPMemoryManager *pRVar1;
  uint8_t *puVar2;
  RTPTime *receivetime_local;
  size_t reasonlen_local;
  uint8_t *reason_local;
  RTPInternalSourceData *this_local;
  
  if ((this->super_RTPSourceData).byereason != (uint8_t *)0x0) {
    puVar2 = (this->super_RTPSourceData).byereason;
    pRVar1 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDeleteByteArray(puVar2,pRVar1);
    (this->super_RTPSourceData).byereason = (uint8_t *)0x0;
    (this->super_RTPSourceData).byereasonlen = 0;
  }
  (this->super_RTPSourceData).byetime.m_t = receivetime->m_t;
  pRVar1 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
  puVar2 = (uint8_t *)operator_new__(reasonlen,pRVar1,5);
  (this->super_RTPSourceData).byereason = puVar2;
  if ((this->super_RTPSourceData).byereason == (uint8_t *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    memcpy((this->super_RTPSourceData).byereason,reason,reasonlen);
    (this->super_RTPSourceData).byereasonlen = reasonlen;
    (this->super_RTPSourceData).receivedbye = true;
    RTPSourceStats::SetLastMessageTime(&(this->super_RTPSourceData).stats,receivetime);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPInternalSourceData::ProcessBYEPacket(const uint8_t *reason,size_t reasonlen,const RTPTime &receivetime)
{
	if (byereason)
	{
		RTPDeleteByteArray(byereason,GetMemoryManager());
		byereason = 0;
		byereasonlen = 0;
	}

	byetime = receivetime;
	byereason = RTPNew(GetMemoryManager(),RTPMEM_TYPE_BUFFER_RTCPBYEREASON) uint8_t[reasonlen];
	if (byereason == 0)
		return ERR_RTP_OUTOFMEM;
	memcpy(byereason,reason,reasonlen);
	byereasonlen = reasonlen;
	receivedbye = true;
	stats.SetLastMessageTime(receivetime);
	return 0;
}